

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O2

int __thiscall TreeItem::row(TreeItem *this)

{
  TreeItem *pTVar1;
  int iVar2;
  int iVar3;
  
  pTVar1 = this->parentItem;
  if (pTVar1 != (TreeItem *)0x0) {
    iVar2 = (int)(pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
                 _M_impl._M_node._M_size;
    if (iVar2 < 1) {
      iVar2 = 0;
    }
    for (iVar3 = 0; iVar2 != iVar3; iVar3 = iVar3 + 1) {
      pTVar1 = (TreeItem *)
               (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      if ((TreeItem *)
          (pTVar1->childItems).super__List_base<TreeItem_*,_std::allocator<TreeItem_*>_>._M_impl.
          _M_node._M_size == this) {
        return iVar3;
      }
    }
  }
  return 0;
}

Assistant:

int TreeItem::row() const
{
    if (parentItem) {
        std::list<TreeItem*>::const_iterator iter = parentItem->childItems.begin();
        for (int i = 0; i < (int)parentItem->childItems.size(); ++i, ++iter) {
            if (const_cast<TreeItem*>(this) == *iter)
                return i;
        }
    }
    return 0;
}